

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::CheckOpcode1
          (TypeChecker *this,Opcode opcode,Limits *limits,bool has_address_operands)

{
  Type TVar1;
  Result RVar2;
  Address AVar3;
  char *desc;
  undefined3 in_register_00000009;
  bool bVar4;
  Opcode opcode_local;
  
  opcode_local = opcode;
  TVar1 = Opcode::GetParamType1(&opcode_local);
  bVar4 = true;
  if (CONCAT31(in_register_00000009,has_address_operands) == 0) {
    AVar3 = Opcode::GetMemorySize(&opcode_local);
    bVar4 = AVar3 != 0;
  }
  if ((limits != (Limits *)0x0) && ((limits->is_64 & bVar4) != 0)) {
    TVar1.enum_ = I64;
  }
  desc = Opcode::GetName(&opcode_local);
  RVar2 = PopAndCheck1Type(this,TVar1,desc);
  TVar1 = Opcode::GetResultType(&opcode_local);
  if (((has_address_operands) && (limits != (Limits *)0x0)) && (limits->is_64 != false)) {
    TVar1.enum_ = I64;
  }
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode,
                                 const Limits* limits,
                                 bool has_address_operands) {
  Result result =
      PopAndCheck1Type(opcode.GetMemoryParam(
                           opcode.GetParamType1(), limits,
                           has_address_operands || opcode.GetMemorySize() != 0),
                       opcode.GetName());
  PushType(has_address_operands
               ? opcode.GetMemoryParam(opcode.GetResultType(), limits, true)
               : opcode.GetResultType());
  return result;
}